

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_file_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t *fsize)

{
  int iVar1;
  char *basename_00;
  int rt;
  char *basename;
  int Nfile_local;
  int nmemb_local;
  char *dtype_local;
  char *blockname_local;
  BigBlock *block_local;
  BigFile *bf_local;
  
  iVar1 = _big_file_mksubdir_r(bf->basename,blockname);
  if (iVar1 == 0) {
    basename_00 = _path_join(bf->basename,blockname);
    bf_local._4_4_ = _big_block_create(block,basename_00,dtype,nmemb,Nfile,fsize);
    free(basename_00);
  }
  else {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x124);
    bf_local._4_4_ = -1;
  }
  return bf_local._4_4_;
}

Assistant:

int
big_file_create_block(BigFile * bf, BigBlock * block, const char * blockname, const char * dtype, int nmemb, int Nfile, const size_t fsize[])
{
    RAISEIF(0 != _big_file_mksubdir_r(bf->basename, blockname),
            ex_subdir,
            NULL);
    char * basename = _path_join(bf->basename, blockname);
    int rt = _big_block_create(block, basename, dtype, nmemb, Nfile, fsize);
    free(basename);
    return rt;
ex_subdir:
    return -1;
}